

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

void cpu_stl_data_ra_mips64
               (CPUArchState_conflict10 *env,target_ulong ptr,uint32_t val,uintptr_t retaddr)

{
  int mmu_idx;
  uintptr_t retaddr_local;
  uint32_t val_local;
  target_ulong ptr_local;
  CPUArchState_conflict10 *env_local;
  
  mmu_idx = cpu_mmu_index(env,false);
  cpu_stl_mmuidx_ra_mips64(env,ptr,val,mmu_idx,retaddr);
  return;
}

Assistant:

void cpu_stl_data_ra(CPUArchState *env, target_ulong ptr,
                     uint32_t val, uintptr_t retaddr)
{
    cpu_stl_mmuidx_ra(env, ptr, val, cpu_mmu_index(env, false), retaddr);
}